

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O0

bool __thiscall branch_and_reduce_algorithm::almost_dominated(branch_and_reduce_algorithm *this)

{
  int iVar1;
  bool bVar2;
  reference pvVar3;
  reference pvVar4;
  reference piVar5;
  iterator iStack_78;
  int w;
  iterator __end5;
  iterator __begin5;
  value_type *__range5;
  int local_58;
  int vtx;
  int cnt;
  int u_1;
  iterator __end3_1;
  iterator __begin3_1;
  value_type *__range3_1;
  iterator iStack_30;
  int u;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  int v;
  bool found;
  branch_and_reduce_algorithm *this_local;
  
  __range3._7_1_ = false;
  __range3._0_4_ = 0;
  do {
    if (this->n <= (int)__range3) {
      return __range3._7_1_;
    }
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->x,(long)(int)__range3);
    if (*pvVar3 < 0) {
      fast_set::clear(&this->used);
      fast_set::add(&this->used,(int)__range3);
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&this->adj,(long)(int)__range3);
      __end3 = std::vector<int,_std::allocator<int>_>::begin(pvVar4);
      iStack_30 = std::vector<int,_std::allocator<int>_>::end(pvVar4);
      while (bVar2 = __gnu_cxx::operator!=(&__end3,&stack0xffffffffffffffd0), bVar2) {
        piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&__end3);
        iVar1 = *piVar5;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->x,(long)iVar1);
        if (*pvVar3 < 0) {
          fast_set::add(&this->used,iVar1);
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end3);
      }
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&this->adj,(long)(int)__range3);
      __end3_1 = std::vector<int,_std::allocator<int>_>::begin(pvVar4);
      _cnt = std::vector<int,_std::allocator<int>_>::end(pvVar4);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )&cnt), bVar2) {
        piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&__end3_1);
        vtx = *piVar5;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->x,(long)vtx);
        if (*pvVar3 < 0) {
          local_58 = 0;
          __range5._4_4_ = -1;
          pvVar4 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[](&this->adj,(long)vtx);
          __end5 = std::vector<int,_std::allocator<int>_>::begin(pvVar4);
          iStack_78 = std::vector<int,_std::allocator<int>_>::end(pvVar4);
          while (bVar2 = __gnu_cxx::operator!=(&__end5,&stack0xffffffffffffff88), bVar2) {
            piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&__end5);
            iVar1 = *piVar5;
            pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->x,(long)iVar1);
            if ((*pvVar3 < 0) && (bVar2 = fast_set::get(&this->used,iVar1), !bVar2)) {
              local_58 = local_58 + 1;
              __range5._4_4_ = iVar1;
            }
            if (1 < local_58) goto LAB_0011891b;
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                      (&__end5);
          }
          __range3._7_1_ = true;
          std::vector<int,_std::allocator<int>_>::push_back
                    (&this->b_vtcs,(value_type_conflict1 *)((long)&__range5 + 4));
        }
LAB_0011891b:
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end3_1);
      }
    }
    __range3._0_4_ = (int)__range3 + 1;
  } while( true );
}

Assistant:

bool branch_and_reduce_algorithm::almost_dominated()
{
    bool found = false;
    for (int v = 0; v < n; v++)
        if (x[v] < 0)
        {
            used.clear();
            used.add(v);
            for (int u : adj[v])
                if (x[u] < 0)
                    used.add(u);
            for (int u : adj[v])
                if (x[u] < 0)
                {
                    int cnt = 0;
                    int vtx = -1;
                    for (int w : adj[u])
                    {
                        if (x[w] < 0 && !used.get(w))
                        {
                            cnt++;
                            vtx = w;
                        }
                        if (cnt >= 2)
                            goto loop;
                    }
                    found = true;
                    b_vtcs.push_back(vtx);

                loop:;
                }
        }
    return found;
}